

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListHasAnyOrAllBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  pointer pEVar4;
  undefined8 uVar5;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  LogicalType common_child;
  LogicalType *rhs_child;
  LogicalType *lhs_child;
  LogicalType *rhs_list;
  LogicalType *lhs_list;
  bool rhs_is_param;
  bool lhs_is_param;
  LogicalType *in_stack_00000398;
  reference in_stack_fffffffffffffd88;
  LogicalType *in_stack_fffffffffffffd90;
  LogicalType *in_stack_fffffffffffffd98;
  LogicalType *in_stack_fffffffffffffda0;
  LogicalType *in_stack_fffffffffffffda8;
  allocator *paVar6;
  LogicalType *in_stack_fffffffffffffdb0;
  LogicalType *left;
  undefined4 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  bool local_231;
  ParameterNotResolvedException *in_stack_fffffffffffffdd0;
  LogicalType *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_fffffffffffffde0;
  ClientContext *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalType local_170;
  undefined1 local_151;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  LogicalType local_c8;
  byte local_a9;
  LogicalType *local_78;
  LogicalType *local_70;
  LogicalType *local_68;
  LogicalType *local_60;
  byte local_52;
  byte local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  this._M_head_impl = (FunctionData *)in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd88);
  BoundCastExpression::AddArrayCastToList(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x2021bc7);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x2021bd4);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  params_1 = &local_50;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd88);
  BoundCastExpression::AddArrayCastToList(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd90,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd88);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x2021c6b);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x2021c78);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])();
  local_51 = (byte)iVar2 & 1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])();
  local_52 = (byte)uVar3 & 1;
  if (((local_51 & 1) != 0) && ((uVar3 & 1) != 0)) {
    uVar5 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(in_stack_fffffffffffffdd0);
    __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  local_60 = &pEVar4->return_type;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd90);
  local_68 = &pEVar4->return_type;
  if ((local_51 & 1) == 0) {
    if ((local_52 & 1) == 0) {
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      child = local_68;
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      local_70 = ListType::GetChildType(in_stack_fffffffffffffd90);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      local_78 = ListType::GetChildType(in_stack_fffffffffffffd90);
      LogicalType::LogicalType
                (in_stack_fffffffffffffdb0,(LogicalTypeId)((ulong)in_stack_fffffffffffffda8 >> 0x38)
                );
      local_a9 = 0;
      bVar1 = LogicalType::operator!=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_231 = false;
      params_2 = local_10;
      if (bVar1) {
        LogicalType::LogicalType
                  (in_stack_fffffffffffffdb0,
                   (LogicalTypeId)((ulong)in_stack_fffffffffffffda8 >> 0x38));
        local_a9 = 1;
        in_stack_fffffffffffffdbf =
             LogicalType::operator!=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        local_231 = false;
        params_2 = local_10;
        if ((bool)in_stack_fffffffffffffdbf) {
          in_stack_fffffffffffffdbe =
               LogicalType::operator!=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
          local_231 = (bool)in_stack_fffffffffffffdbe;
          params_2 = local_10;
        }
      }
      if ((local_a9 & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x20220e5);
      }
      LogicalType::~LogicalType((LogicalType *)0x20220f2);
      if ((local_231 & 1U) != 0) {
        left = &local_c8;
        LogicalType::LogicalType((LogicalType *)0x2022111);
        bVar1 = LogicalType::TryGetMaxLogicalType
                          ((ClientContext *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT15(local_231,
                                                      CONCAT14(in_stack_fffffffffffffdbc,
                                                               in_stack_fffffffffffffdb8)))),left,
                           in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        if (!bVar1) {
          local_151 = 1;
          uVar5 = __cxa_allocate_exception(0x10);
          paVar6 = &local_e9;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_e8,"\'%s\' cannot compare lists of different types: \'%s\' and \'%s\'",
                     paVar6);
          ::std::__cxx11::string::string(local_110,(string *)(local_18 + 8));
          LogicalType::ToString_abi_cxx11_(in_stack_00000398);
          LogicalType::ToString_abi_cxx11_(in_stack_00000398);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((BinderException *)this._M_head_impl,in_RDI,params,params_1,params_2);
          local_151 = 0;
          __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
        }
        LogicalType::LIST(child);
        vector<duckdb::LogicalType,_true>::operator[]
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                   (size_type)in_stack_fffffffffffffd88);
        in_stack_fffffffffffffd90 = &local_170;
        LogicalType::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        LogicalType::~LogicalType((LogicalType *)0x20223b4);
        LogicalType::LIST(child);
        in_stack_fffffffffffffd88 =
             vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                        (size_type)in_stack_fffffffffffffd88);
        LogicalType::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        LogicalType::~LogicalType((LogicalType *)0x2022405);
        LogicalType::~LogicalType((LogicalType *)0x2022412);
      }
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
    else {
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
                 (size_type)in_stack_fffffffffffffd88);
      LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<std::default_delete<duckdb::FunctionData>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
  }
  else {
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
               (size_type)in_stack_fffffffffffffd88);
    LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd90,
               (size_type)in_stack_fffffffffffffd88);
    LogicalType::operator=(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListHasAnyOrAllBind(ClientContext &context, ScalarFunction &bound_function,
                                                    vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	arguments[1] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[1]));

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_list = arguments[0]->return_type;
	const auto &rhs_list = arguments[1]->return_type;

	if (lhs_is_param) {
		bound_function.arguments[0] = rhs_list;
		bound_function.arguments[1] = rhs_list;
		return nullptr;
	}
	if (rhs_is_param) {
		bound_function.arguments[0] = lhs_list;
		bound_function.arguments[1] = lhs_list;
		return nullptr;
	}

	bound_function.arguments[0] = lhs_list;
	bound_function.arguments[1] = rhs_list;

	const auto &lhs_child = ListType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_child = ListType::GetChildType(bound_function.arguments[1]);

	if (lhs_child != LogicalType::SQLNULL && rhs_child != LogicalType::SQLNULL && lhs_child != rhs_child) {
		LogicalType common_child;
		if (!LogicalType::TryGetMaxLogicalType(context, lhs_child, rhs_child, common_child)) {
			throw BinderException("'%s' cannot compare lists of different types: '%s' and '%s'", bound_function.name,
			                      lhs_child.ToString(), rhs_child.ToString());
		}
		bound_function.arguments[0] = LogicalType::LIST(common_child);
		bound_function.arguments[1] = LogicalType::LIST(common_child);
	}

	return nullptr;
}